

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

Instr * LowererMD::InsertCmovCC
                  (OpCode opCode,Opnd *dst,Opnd *src1,Instr *insertBeforeInstr,bool postRegAlloc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *instr_00;
  Instr *instr;
  Opnd *src2;
  Func *func;
  bool postRegAlloc_local;
  Instr *insertBeforeInstr_local;
  Opnd *src1_local;
  Opnd *dst_local;
  OpCode opCode_local;
  
  if (opCode < ADD) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x227f,"(opCode > Js::OpCode::MDStart)","opCode > Js::OpCode::MDStart");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  instr = (Instr *)0x0;
  insertBeforeInstr_local = (Instr *)src1;
  if (!postRegAlloc) {
    instr = (Instr *)src1;
    insertBeforeInstr_local = (Instr *)dst;
  }
  instr_00 = IR::Instr::New(opCode,dst,(Opnd *)insertBeforeInstr_local,(Opnd *)instr,
                            insertBeforeInstr->m_func);
  IR::Instr::InsertBefore(insertBeforeInstr,instr_00);
  Legalize<false>(instr_00,false);
  return instr_00;
}

Assistant:

IR::Instr*
LowererMD::InsertCmovCC(const Js::OpCode opCode, IR::Opnd * dst, IR::Opnd* src1, IR::Instr* insertBeforeInstr, bool postRegAlloc)
{
    Assert(opCode > Js::OpCode::MDStart);
    Func* func = insertBeforeInstr->m_func;

    IR::Opnd* src2 = nullptr;
    if (!postRegAlloc)
    {
        src2 = src1;
        src1 = dst;
    }
    IR::Instr * instr = IR::Instr::New(opCode, dst, src1, src2, func);
    insertBeforeInstr->InsertBefore(instr);
    LowererMD::Legalize(instr);

    return instr;
}